

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O3

void apply_to_each(dill_stream c,void *insns,virtual_mach_info vmi,apply_func func)

{
  basic_block_conflict pbVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = vmi->bbcount;
  if (iVar2 != 0) {
    uVar4 = 0;
    do {
      pbVar1 = vmi->bblist;
      uVar3 = pbVar1[uVar4].start;
      if (uVar3 <= (ulong)pbVar1[uVar4].end) {
        do {
          (*func)(c,pbVar1 + uVar4,(virtual_insn *)insns,(int)uVar3);
          uVar3 = uVar3 + 1;
        } while (uVar3 <= (ulong)pbVar1[uVar4].end);
        iVar2 = vmi->bbcount;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)(long)iVar2);
  }
  return;
}

Assistant:

static void
apply_to_each(dill_stream c,
              void* insns,
              virtual_mach_info vmi,
              apply_func func)
{
    size_t i, j = 0;

    for (i = 0; i < vmi->bbcount; i++) {
        basic_block bb = &vmi->bblist[i];
        for (j = (size_t)bb->start; j <= (size_t)bb->end; j++) {
            (func)(c, bb, insns, (int)j);
        }
    }
}